

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O3

int mbedtls_x509_info_key_usage(char **buf,size_t *size,uint key_usage)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  char *__s;
  ulong __maxlen;
  bool bVar4;
  
  __maxlen = *size;
  __s = *buf;
  if ((char)key_usage < '\0') {
    uVar1 = snprintf(__s,__maxlen,"%sDigital Signature",anon_var_dwarf_66ec33 + 9);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    uVar3 = (ulong)uVar1;
    bVar4 = __maxlen < uVar3;
    __maxlen = __maxlen - uVar3;
    if (bVar4 || __maxlen == 0) {
      return -0x2980;
    }
    __s = __s + uVar3;
    pcVar2 = ", ";
  }
  else {
    pcVar2 = anon_var_dwarf_66ec33 + 9;
  }
  if ((key_usage & 0x40) != 0) {
    uVar1 = snprintf(__s,__maxlen,"%sNon Repudiation",pcVar2);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    uVar3 = (ulong)uVar1;
    bVar4 = __maxlen < uVar3;
    __maxlen = __maxlen - uVar3;
    if (bVar4 || __maxlen == 0) {
      return -0x2980;
    }
    __s = __s + uVar3;
    pcVar2 = ", ";
  }
  if ((key_usage & 0x20) != 0) {
    uVar1 = snprintf(__s,__maxlen,"%sKey Encipherment",pcVar2);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    uVar3 = (ulong)uVar1;
    bVar4 = __maxlen < uVar3;
    __maxlen = __maxlen - uVar3;
    if (bVar4 || __maxlen == 0) {
      return -0x2980;
    }
    __s = __s + uVar3;
    pcVar2 = ", ";
  }
  if ((key_usage & 0x10) != 0) {
    uVar1 = snprintf(__s,__maxlen,"%sData Encipherment",pcVar2);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    uVar3 = (ulong)uVar1;
    bVar4 = __maxlen < uVar3;
    __maxlen = __maxlen - uVar3;
    if (bVar4 || __maxlen == 0) {
      return -0x2980;
    }
    __s = __s + uVar3;
    pcVar2 = ", ";
  }
  if ((key_usage & 8) != 0) {
    uVar1 = snprintf(__s,__maxlen,"%sKey Agreement",pcVar2);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    uVar3 = (ulong)uVar1;
    bVar4 = __maxlen < uVar3;
    __maxlen = __maxlen - uVar3;
    if (bVar4 || __maxlen == 0) {
      return -0x2980;
    }
    __s = __s + uVar3;
    pcVar2 = ", ";
  }
  if ((key_usage & 4) != 0) {
    uVar1 = snprintf(__s,__maxlen,"%sKey Cert Sign",pcVar2);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    uVar3 = (ulong)uVar1;
    bVar4 = __maxlen < uVar3;
    __maxlen = __maxlen - uVar3;
    if (bVar4 || __maxlen == 0) {
      return -0x2980;
    }
    __s = __s + uVar3;
    pcVar2 = ", ";
  }
  if ((key_usage & 2) != 0) {
    uVar1 = snprintf(__s,__maxlen,"%sCRL Sign",pcVar2);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    uVar3 = (ulong)uVar1;
    bVar4 = __maxlen < uVar3;
    __maxlen = __maxlen - uVar3;
    if (bVar4 || __maxlen == 0) {
      return -0x2980;
    }
    __s = __s + uVar3;
    pcVar2 = ", ";
  }
  if ((key_usage & 1) != 0) {
    uVar1 = snprintf(__s,__maxlen,"%sEncipher Only",pcVar2);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    uVar3 = (ulong)uVar1;
    bVar4 = __maxlen < uVar3;
    __maxlen = __maxlen - uVar3;
    if (bVar4 || __maxlen == 0) {
      return -0x2980;
    }
    __s = __s + uVar3;
    pcVar2 = ", ";
  }
  if ((short)key_usage < 0) {
    uVar1 = snprintf(__s,__maxlen,"%sDecipher Only",pcVar2);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    uVar3 = (ulong)uVar1;
    bVar4 = __maxlen < uVar3;
    __maxlen = __maxlen - uVar3;
    if (bVar4 || __maxlen == 0) {
      return -0x2980;
    }
    __s = __s + uVar3;
  }
  *size = __maxlen;
  *buf = __s;
  return 0;
}

Assistant:

int mbedtls_x509_info_key_usage(char **buf, size_t *size,
                                unsigned int key_usage)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t n = *size;
    char *p = *buf;
    const char *sep = "";

    KEY_USAGE(MBEDTLS_X509_KU_DIGITAL_SIGNATURE,    "Digital Signature");
    KEY_USAGE(MBEDTLS_X509_KU_NON_REPUDIATION,      "Non Repudiation");
    KEY_USAGE(MBEDTLS_X509_KU_KEY_ENCIPHERMENT,     "Key Encipherment");
    KEY_USAGE(MBEDTLS_X509_KU_DATA_ENCIPHERMENT,    "Data Encipherment");
    KEY_USAGE(MBEDTLS_X509_KU_KEY_AGREEMENT,        "Key Agreement");
    KEY_USAGE(MBEDTLS_X509_KU_KEY_CERT_SIGN,        "Key Cert Sign");
    KEY_USAGE(MBEDTLS_X509_KU_CRL_SIGN,             "CRL Sign");
    KEY_USAGE(MBEDTLS_X509_KU_ENCIPHER_ONLY,        "Encipher Only");
    KEY_USAGE(MBEDTLS_X509_KU_DECIPHER_ONLY,        "Decipher Only");

    *size = n;
    *buf = p;

    return 0;
}